

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::BufferPartialMapWriteCase::iterate(BufferPartialMapWriteCase *this)

{
  int iVar1;
  RenderContext *renderCtx;
  deUint32 seed;
  deUint32 buffer;
  GLenum GVar2;
  deBool dVar3;
  uint uVar4;
  char *pcVar5;
  TestLog *log;
  deUint8 *pdVar6;
  void *dst;
  TestError *this_00;
  bool isOk;
  void *ptr;
  deUint32 buf;
  BufferVerifier local_38;
  BufferVerifier verifier;
  ReferenceBuffer refBuf;
  deUint32 dataSeed;
  BufferPartialMapWriteCase *this_local;
  
  pcVar5 = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(pcVar5);
  deqp::gls::BufferTestUtil::ReferenceBuffer::ReferenceBuffer((ReferenceBuffer *)&verifier);
  renderCtx = (this->super_BufferCase).m_renderCtx;
  log = tcu::TestContext::getLog((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx);
  deqp::gls::BufferTestUtil::BufferVerifier::BufferVerifier(&local_38,renderCtx,log,this->m_verify);
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize
            ((ReferenceBuffer *)&verifier,this->m_bufferSize);
  pdVar6 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,0);
  deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar6,this->m_bufferSize,seed);
  buffer = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,buffer);
  GVar2 = this->m_bufferTarget;
  iVar1 = this->m_bufferSize;
  pdVar6 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BufferCase).super_CallLogWrapper,GVar2,(long)iVar1,pdVar6,this->m_usage);
  pdVar6 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr
                     ((ReferenceBuffer *)&verifier,this->m_mapOffset);
  deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar6,this->m_mapSize,seed & 0xabcdef);
  dst = glu::CallLogWrapper::glMapBufferRange
                  (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,
                   (long)this->m_mapOffset,(long)this->m_mapSize,2);
  GVar2 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
  glu::checkError(GVar2,"glMapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                  ,0xbc);
  while( true ) {
    dVar3 = ::deGetFalse();
    if ((dVar3 != 0) || (dst == (void *)0x0)) break;
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      pdVar6 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr
                         ((ReferenceBuffer *)&verifier,this->m_mapOffset);
      ::deMemcpy(dst,pdVar6,(long)this->m_mapSize);
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget);
      GVar2 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
      glu::checkError(GVar2,"glUnmapBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                      ,0xc1);
      pdVar6 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,0);
      uVar4 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                        (&local_38,(EVP_PKEY_CTX *)(ulong)buffer,pdVar6,0,
                         (uchar *)(ulong)(uint)this->m_bufferSize,(ulong)this->m_bufferTarget);
      deqp::gls::BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,buffer);
      pcVar5 = "Buffer verification failed";
      if ((uVar4 & 1) != 0) {
        pcVar5 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~((byte)uVar4 & 1) & QP_TEST_RESULT_FAIL,pcVar5);
      deqp::gls::BufferTestUtil::BufferVerifier::~BufferVerifier(&local_38);
      deqp::gls::BufferTestUtil::ReferenceBuffer::~ReferenceBuffer((ReferenceBuffer *)&verifier);
      return STOP;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
             ,0xbd);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate (void)
	{
		deUint32		dataSeed	= deStringHash(getName());
		ReferenceBuffer	refBuf;
		BufferVerifier	verifier	(m_renderCtx, m_testCtx.getLog(), m_verify);

		// Setup reference data.
		refBuf.setSize(m_bufferSize);
		fillWithRandomBytes(refBuf.getPtr(), m_bufferSize, dataSeed);

		deUint32 buf = genBuffer();
		glBindBuffer(m_bufferTarget, buf);
		glBufferData(m_bufferTarget, m_bufferSize, refBuf.getPtr(), m_usage);

		// Do reference map.
		fillWithRandomBytes(refBuf.getPtr(m_mapOffset), m_mapSize, dataSeed&0xabcdef);

		void* ptr = glMapBufferRange(m_bufferTarget, m_mapOffset, m_mapSize, GL_MAP_WRITE_BIT);
		GLU_CHECK_MSG("glMapBufferRange");
		TCU_CHECK(ptr);

		deMemcpy(ptr, refBuf.getPtr(m_mapOffset), m_mapSize);
		glUnmapBuffer(m_bufferTarget);
		GLU_CHECK_MSG("glUnmapBuffer");

		bool isOk = verifier.verify(buf, refBuf.getPtr(), 0, m_bufferSize, m_bufferTarget);
		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}